

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlChar * xmlSaveUri(xmlURIPtr uri)

{
  byte *pbVar1;
  char *pcVar2;
  char cVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlChar xVar8;
  byte bVar9;
  uint uVar10;
  byte *pbVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int max;
  xmlURIPtr local_38;
  
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  max = 0x50;
  pxVar4 = (xmlChar *)(*xmlMalloc)(0x51);
  iVar12 = 0;
  if (pxVar4 == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  pcVar2 = uri->scheme;
  local_38 = uri;
  if (pcVar2 != (char *)0x0) {
    for (uVar15 = 0; xVar8 = pcVar2[uVar15], xVar8 != '\0'; uVar15 = uVar15 + 1) {
      pxVar5 = pxVar4;
      if ((long)max <= (long)uVar15) {
        pxVar5 = xmlSaveUriRealloc(pxVar4,&max);
        if (pxVar5 == (xmlChar *)0x0) goto LAB_00150e75;
        xVar8 = pcVar2[uVar15];
      }
      pxVar5[uVar15] = xVar8;
      pxVar4 = pxVar5;
    }
    pxVar5 = pxVar4;
    if ((max <= (int)uVar15) && (pxVar5 = xmlSaveUriRealloc(pxVar4,&max), pxVar5 == (xmlChar *)0x0))
    goto LAB_00150e75;
    iVar12 = (int)uVar15 + 1;
    pxVar5[uVar15 & 0xffffffff] = ':';
    pxVar4 = pxVar5;
  }
  pbVar11 = (byte *)local_38->opaque;
  pxVar5 = pxVar4;
  if (pbVar11 == (byte *)0x0) {
    if ((local_38->server == (char *)0x0) && (local_38->port == 0)) {
      if (local_38->authority == (char *)0x0) {
        if (((local_38->scheme != (char *)0x0) && (max <= iVar12 + 3)) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar4,&max), pxVar5 == (xmlChar *)0x0)) goto LAB_00150e75;
      }
      else {
        if ((max <= iVar12 + 3) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar4,&max), pxVar5 == (xmlChar *)0x0)) goto LAB_00150e75;
        (pxVar5 + iVar12)[0] = '/';
        (pxVar5 + iVar12)[1] = '/';
        pxVar4 = pxVar5;
        iVar12 = iVar12 + 2;
        for (pbVar11 = (byte *)local_38->authority; bVar9 = *pbVar11, pxVar5 = pxVar4, bVar9 != 0;
            pbVar11 = pbVar11 + 1) {
          iVar14 = iVar12 + 3;
          if (max <= iVar14) {
            pxVar5 = xmlSaveUriRealloc(pxVar4,&max);
            if (pxVar5 == (xmlChar *)0x0) goto LAB_00150e75;
            bVar9 = *pbVar11;
          }
          if (((((byte)(bVar9 - 0x30) < 10) || ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar9 - 0x21 < 0x3f &&
               ((0x4000000096003fe9U >> ((ulong)(bVar9 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar9 == 0x7e)) {
            iVar14 = iVar12 + 1;
            iVar13 = iVar12;
          }
          else {
            pxVar5[iVar12] = '%';
            cVar3 = '0';
            if (0x9f < bVar9) {
              cVar3 = '7';
            }
            iVar13 = iVar12 + 2;
            pxVar5[(long)iVar12 + 1] = cVar3 + (bVar9 >> 4);
            cVar3 = '0';
            if (9 < (bVar9 & 0xf)) {
              cVar3 = '7';
            }
            bVar9 = cVar3 + (bVar9 & 0xf);
          }
          pxVar5[iVar13] = bVar9;
          pxVar4 = pxVar5;
          iVar12 = iVar14;
        }
      }
    }
    else {
      if ((max <= iVar12 + 3) && (pxVar5 = xmlSaveUriRealloc(pxVar4,&max), pxVar5 == (xmlChar *)0x0)
         ) goto LAB_00150e75;
      (pxVar5 + iVar12)[0] = '/';
      (pxVar5 + iVar12)[1] = '/';
      uVar15 = (ulong)(iVar12 + 2);
      pbVar11 = (byte *)local_38->user;
      if (pbVar11 != (byte *)0x0) {
        pxVar4 = pxVar5;
        while( true ) {
          bVar9 = *pbVar11;
          iVar12 = (int)uVar15;
          uVar10 = iVar12 + 3;
          if (bVar9 == 0) break;
          pxVar5 = pxVar4;
          if (max <= (int)uVar10) {
            pxVar5 = xmlSaveUriRealloc(pxVar4,&max);
            if (pxVar5 == (xmlChar *)0x0) goto LAB_00150e75;
            bVar9 = *pbVar11;
          }
          if (((((byte)(bVar9 - 0x30) < 10) || ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar9 - 0x21 < 0x3f &&
               ((0x4000000016003fe9U >> ((ulong)(bVar9 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar9 == 0x7e)) {
            uVar10 = iVar12 + 1;
            iVar14 = iVar12;
          }
          else {
            pxVar5[iVar12] = '%';
            cVar3 = '0';
            if (0x9f < bVar9) {
              cVar3 = '7';
            }
            iVar14 = iVar12 + 2;
            pxVar5[(long)iVar12 + 1] = cVar3 + (bVar9 >> 4);
            cVar3 = '0';
            if (9 < (bVar9 & 0xf)) {
              cVar3 = '7';
            }
            bVar9 = cVar3 + (bVar9 & 0xf);
          }
          pxVar5[iVar14] = bVar9;
          pbVar11 = pbVar11 + 1;
          uVar15 = (ulong)uVar10;
          pxVar4 = pxVar5;
        }
        pxVar5 = pxVar4;
        if ((max <= (int)uVar10) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar4,&max), pxVar5 == (xmlChar *)0x0)) goto LAB_00150e75;
        uVar15 = (ulong)(iVar12 + 1);
        pxVar5[iVar12] = '@';
      }
      pxVar6 = (xmlChar *)local_38->server;
      if (pxVar6 != (xmlChar *)0x0) {
        uVar15 = (ulong)(int)uVar15;
        for (; xVar8 = *pxVar6, xVar8 != '\0'; pxVar6 = pxVar6 + 1) {
          pxVar7 = pxVar5;
          if ((long)max <= (long)uVar15) {
            pxVar7 = xmlSaveUriRealloc(pxVar5,&max);
            pxVar4 = pxVar5;
            if (pxVar7 == (xmlChar *)0x0) goto LAB_00150e75;
            xVar8 = *pxVar6;
          }
          pxVar7[uVar15] = xVar8;
          uVar15 = uVar15 + 1;
          pxVar5 = pxVar7;
        }
      }
      iVar12 = (int)uVar15;
      uVar10 = local_38->port;
      if (0 < (int)uVar10) {
        pxVar6 = pxVar5;
        if (max <= iVar12 + 10) {
          pxVar6 = xmlSaveUriRealloc(pxVar5,&max);
          pxVar4 = pxVar5;
          if (pxVar6 == (xmlChar *)0x0) goto LAB_00150e75;
          uVar10 = local_38->port;
        }
        iVar14 = snprintf((char *)(pxVar6 + iVar12),(long)(max - iVar12),":%d",(ulong)uVar10);
        iVar12 = iVar14 + iVar12;
        pxVar5 = pxVar6;
      }
    }
    pbVar11 = (byte *)local_38->path;
    if (pbVar11 != (byte *)0x0) {
      if ((((xmlChar *)local_38->scheme != (xmlChar *)0x0) && (*pbVar11 == 0x2f)) &&
         (((byte)((pbVar11[1] & 0xdf) + 0xbf) < 0x1a &&
          ((pbVar11[2] == 0x3a &&
           (iVar14 = xmlStrEqual((xmlChar *)local_38->scheme,(xmlChar *)"file"), iVar14 != 0)))))) {
        pxVar6 = pxVar5;
        if ((max <= iVar12 + 3) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar5,&max), pxVar4 = pxVar5, pxVar6 == (xmlChar *)0x0))
        goto LAB_00150e75;
        pxVar6[iVar12] = *pbVar11;
        pxVar6[(long)iVar12 + 1] = pbVar11[1];
        pbVar1 = pbVar11 + 2;
        pbVar11 = pbVar11 + 3;
        pxVar6[(long)iVar12 + 2] = *pbVar1;
        pxVar5 = pxVar6;
        iVar12 = iVar12 + 3;
      }
      for (; bVar9 = *pbVar11, bVar9 != 0; pbVar11 = pbVar11 + 1) {
        iVar14 = iVar12 + 3;
        pxVar6 = pxVar5;
        if (max <= iVar14) {
          pxVar6 = xmlSaveUriRealloc(pxVar5,&max);
          pxVar4 = pxVar5;
          if (pxVar6 == (xmlChar *)0x0) goto LAB_00150e75;
          bVar9 = *pbVar11;
        }
        if (((((byte)(bVar9 - 0x30) < 10) || ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a)) ||
            ((bVar9 - 0x21 < 0x3f &&
             ((0x4000000094007fe9U >> ((ulong)(bVar9 - 0x21) & 0x3f) & 1) != 0)))) ||
           (bVar9 == 0x7e)) {
          iVar14 = iVar12 + 1;
          iVar13 = iVar12;
        }
        else {
          pxVar6[iVar12] = '%';
          cVar3 = '0';
          if (0x9f < bVar9) {
            cVar3 = '7';
          }
          iVar13 = iVar12 + 2;
          pxVar6[(long)iVar12 + 1] = cVar3 + (bVar9 >> 4);
          cVar3 = '0';
          if (9 < (bVar9 & 0xf)) {
            cVar3 = '7';
          }
          bVar9 = cVar3 + (bVar9 & 0xf);
        }
        pxVar6[iVar13] = bVar9;
        pxVar5 = pxVar6;
        iVar12 = iVar14;
      }
    }
    pxVar4 = pxVar5;
    if (local_38->query_raw == (char *)0x0) {
      iVar14 = iVar12;
      if (local_38->query != (char *)0x0) {
        if ((max <= iVar12 + 3) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar5,&max), pxVar5 == (xmlChar *)0x0)) goto LAB_00150e75;
        pxVar5[iVar12] = '?';
        iVar14 = iVar12 + 1;
        for (pbVar11 = (byte *)local_38->query; bVar9 = *pbVar11, bVar9 != 0; pbVar11 = pbVar11 + 1)
        {
          iVar12 = iVar14 + 3;
          pxVar6 = pxVar5;
          if (max <= iVar12) {
            pxVar6 = xmlSaveUriRealloc(pxVar5,&max);
            pxVar4 = pxVar5;
            if (pxVar6 == (xmlChar *)0x0) goto LAB_00150e75;
            bVar9 = *pbVar11;
          }
          if (((((byte)(bVar9 - 0x30) < 10) || ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar9 - 0x21 < 0x3f &&
               ((0x54000000d6007fe9U >> ((ulong)(bVar9 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar9 == 0x7e)) {
            iVar12 = iVar14 + 1;
            iVar13 = iVar14;
          }
          else {
            pxVar6[iVar14] = '%';
            cVar3 = '0';
            if (0x9f < bVar9) {
              cVar3 = '7';
            }
            iVar13 = iVar14 + 2;
            pxVar6[(long)iVar14 + 1] = cVar3 + (bVar9 >> 4);
            cVar3 = '0';
            if (9 < (bVar9 & 0xf)) {
              cVar3 = '7';
            }
            bVar9 = cVar3 + (bVar9 & 0xf);
          }
          pxVar6[iVar13] = bVar9;
          pxVar5 = pxVar6;
          iVar14 = iVar12;
        }
      }
    }
    else {
      iVar14 = iVar12 + 1;
      if ((max <= iVar14) && (pxVar5 = xmlSaveUriRealloc(pxVar5,&max), pxVar5 == (xmlChar *)0x0))
      goto LAB_00150e75;
      pxVar5[iVar12] = '?';
      pxVar6 = (xmlChar *)local_38->query_raw;
      lVar16 = (long)iVar14;
      while( true ) {
        xVar8 = *pxVar6;
        if (xVar8 == '\0') break;
        pxVar7 = pxVar5;
        if ((long)max <= lVar16 + 1) {
          pxVar7 = xmlSaveUriRealloc(pxVar5,&max);
          pxVar4 = pxVar5;
          if (pxVar7 == (xmlChar *)0x0) goto LAB_00150e75;
          xVar8 = *pxVar6;
        }
        pxVar6 = pxVar6 + 1;
        pxVar7[lVar16] = xVar8;
        iVar14 = iVar14 + 1;
        pxVar5 = pxVar7;
        lVar16 = lVar16 + 1;
      }
    }
  }
  else {
    iVar14 = iVar12;
    for (; bVar9 = *pbVar11, bVar9 != 0; pbVar11 = pbVar11 + 1) {
      iVar12 = iVar14 + 3;
      pxVar6 = pxVar5;
      if (max <= iVar12) {
        pxVar6 = xmlSaveUriRealloc(pxVar5,&max);
        pxVar4 = pxVar5;
        if (pxVar6 == (xmlChar *)0x0) goto LAB_00150e75;
        bVar9 = *pbVar11;
      }
      if (((((bVar9 - 0x24 < 0x3a) &&
            ((0x28000001ac00985U >> ((ulong)(bVar9 - 0x24) & 0x3f) & 1) != 0)) ||
           ((byte)(bVar9 - 0x30) < 10)) || ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a)) ||
         (((bVar9 - 0x21 < 0x3f &&
           ((0x40000000000033c1U >> ((ulong)(bVar9 - 0x21) & 0x3f) & 1) != 0)) || (bVar9 == 0x7e))))
      {
        iVar12 = iVar14 + 1;
        iVar13 = iVar14;
      }
      else {
        pxVar6[iVar14] = '%';
        cVar3 = '0';
        if (0x9f < bVar9) {
          cVar3 = '7';
        }
        iVar13 = iVar14 + 2;
        pxVar6[(long)iVar14 + 1] = cVar3 + (bVar9 >> 4);
        cVar3 = '0';
        if (9 < (bVar9 & 0xf)) {
          cVar3 = '7';
        }
        bVar9 = cVar3 + (bVar9 & 0xf);
      }
      pxVar6[iVar13] = bVar9;
      pxVar5 = pxVar6;
      iVar14 = iVar12;
    }
  }
  if (local_38->fragment != (char *)0x0) {
    pxVar6 = pxVar5;
    if ((max <= iVar14 + 3) &&
       (pxVar6 = xmlSaveUriRealloc(pxVar5,&max), pxVar4 = pxVar5, pxVar6 == (xmlChar *)0x0))
    goto LAB_00150e75;
    pxVar6[iVar14] = '#';
    pxVar5 = pxVar6;
    iVar14 = iVar14 + 1;
    for (pbVar11 = (byte *)local_38->fragment; bVar9 = *pbVar11, bVar9 != 0; pbVar11 = pbVar11 + 1)
    {
      iVar12 = iVar14 + 3;
      pxVar6 = pxVar5;
      if (max <= iVar12) {
        pxVar6 = xmlSaveUriRealloc(pxVar5,&max);
        pxVar4 = pxVar5;
        if (pxVar6 == (xmlChar *)0x0) goto LAB_00150e75;
        bVar9 = *pbVar11;
      }
      if (((((byte)(bVar9 - 0x30) < 10) || ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a)) ||
          ((bVar9 - 0x21 < 0x3f &&
           ((0x54000000d6007fe9U >> ((ulong)(bVar9 - 0x21) & 0x3f) & 1) != 0)))) || (bVar9 == 0x7e))
      {
        iVar12 = iVar14 + 1;
        iVar13 = iVar14;
      }
      else {
        pxVar6[iVar14] = '%';
        cVar3 = '0';
        if (0x9f < bVar9) {
          cVar3 = '7';
        }
        iVar13 = iVar14 + 2;
        pxVar6[(long)iVar14 + 1] = cVar3 + (bVar9 >> 4);
        cVar3 = '0';
        if (9 < (bVar9 & 0xf)) {
          cVar3 = '7';
        }
        bVar9 = cVar3 + (bVar9 & 0xf);
      }
      pxVar6[iVar13] = bVar9;
      pxVar5 = pxVar6;
      iVar14 = iVar12;
    }
  }
  pxVar6 = pxVar5;
  if ((iVar14 < max) ||
     (pxVar6 = xmlSaveUriRealloc(pxVar5,&max), pxVar4 = pxVar5, pxVar6 != (xmlChar *)0x0)) {
    pxVar6[iVar14] = '\0';
    return pxVar6;
  }
LAB_00150e75:
  (*xmlFree)(pxVar4);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSaveUri(xmlURIPtr uri) {
    xmlChar *ret = NULL;
    xmlChar *temp;
    const char *p;
    int len;
    int max;

    if (uri == NULL) return(NULL);


    max = 80;
    ret = xmlMalloc(max + 1);
    if (ret == NULL)
	return(NULL);
    len = 0;

    if (uri->scheme != NULL) {
	p = uri->scheme;
	while (*p != 0) {
	    if (len >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
		ret = temp;
	    }
	    ret[len++] = *p++;
	}
	if (len >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = ':';
    }
    if (uri->opaque != NULL) {
	p = uri->opaque;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if (IS_RESERVED(*(p)) || IS_UNRESERVED(*(p)))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    } else {
	if ((uri->server != NULL) || (uri->port != PORT_EMPTY)) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    if (uri->user != NULL) {
		p = uri->user;
		while (*p != 0) {
		    if (len + 3 >= max) {
                        temp = xmlSaveUriRealloc(ret, &max);
                        if (temp == NULL) goto mem_error;
                        ret = temp;
		    }
		    if ((IS_UNRESERVED(*(p))) ||
			((*(p) == ';')) || ((*(p) == ':')) ||
			((*(p) == '&')) || ((*(p) == '=')) ||
			((*(p) == '+')) || ((*(p) == '$')) ||
			((*(p) == ',')))
			ret[len++] = *p++;
		    else {
			int val = *(unsigned char *)p++;
			int hi = val / 0x10, lo = val % 0x10;
			ret[len++] = '%';
			ret[len++] = hi + (hi > 9? 'A'-10 : '0');
			ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		    }
		}
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = '@';
	    }
	    if (uri->server != NULL) {
		p = uri->server;
		while (*p != 0) {
		    if (len >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
                    /* TODO: escaping? */
		    ret[len++] = (xmlChar) *p++;
		}
	    }
            if (uri->port > 0) {
                if (len + 10 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
                }
                len += snprintf((char *) &ret[len], max - len, ":%d", uri->port);
            }
	} else if (uri->authority != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    p = uri->authority;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) ||
                    ((*(p) == '$')) || ((*(p) == ',')) || ((*(p) == ';')) ||
                    ((*(p) == ':')) || ((*(p) == '@')) || ((*(p) == '&')) ||
                    ((*(p) == '=')) || ((*(p) == '+')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	} else if (uri->scheme != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	}
	if (uri->path != NULL) {
	    p = uri->path;
	    /*
	     * the colon in file:///d: should not be escaped or
	     * Windows accesses fail later.
	     */
	    if ((uri->scheme != NULL) &&
		(p[0] == '/') &&
		(((p[1] >= 'a') && (p[1] <= 'z')) ||
		 ((p[1] >= 'A') && (p[1] <= 'Z'))) &&
		(p[2] == ':') &&
	        (xmlStrEqual(BAD_CAST uri->scheme, BAD_CAST "file"))) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
		ret[len++] = *p++;
		ret[len++] = *p++;
	    }
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || ((*(p) == '/')) ||
                    ((*(p) == ';')) || ((*(p) == '@')) || ((*(p) == '&')) ||
	            ((*(p) == '=')) || ((*(p) == '+')) || ((*(p) == '$')) ||
	            ((*(p) == ',')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
	if (uri->query_raw != NULL) {
	    if (len + 1 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query_raw;
	    while (*p != 0) {
		if (len + 1 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
	    }
	} else if (uri->query != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
    }
    if (uri->fragment != NULL) {
	if (len + 3 >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = '#';
	p = uri->fragment;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    }
    if (len >= max) {
        temp = xmlSaveUriRealloc(ret, &max);
        if (temp == NULL) goto mem_error;
        ret = temp;
    }
    ret[len] = 0;
    return(ret);

mem_error:
    xmlFree(ret);
    return(NULL);
}